

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Initiator.cpp
# Opt level: O1

bool __thiscall FIX::Initiator::isLoggedOn(Initiator *this)

{
  int iVar1;
  Session *pSVar2;
  _Base_ptr p_Var3;
  bool bVar4;
  SessionIDs connected;
  _Rb_tree<FIX::SessionID,_FIX::SessionID,_std::_Identity<FIX::SessionID>,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>
  _Stack_58;
  
  Mutex::lock(&this->m_mutex);
  std::
  _Rb_tree<FIX::SessionID,_FIX::SessionID,_std::_Identity<FIX::SessionID>,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>
  ::_Rb_tree(&_Stack_58,&(this->m_connected)._M_t);
  for (p_Var3 = _Stack_58._M_impl.super__Rb_tree_header._M_header._M_left;
      bVar4 = (_Rb_tree_header *)p_Var3 != &_Stack_58._M_impl.super__Rb_tree_header, bVar4;
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
    pSVar2 = Session::lookupSession((SessionID *)(p_Var3 + 1));
    if (((pSVar2->m_state).m_receivedLogon == true) && (((pSVar2->m_state).m_sentLogon & 1U) != 0))
    break;
  }
  std::
  _Rb_tree<FIX::SessionID,_FIX::SessionID,_std::_Identity<FIX::SessionID>,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>
  ::~_Rb_tree(&_Stack_58);
  iVar1 = (this->m_mutex).m_count;
  (this->m_mutex).m_count = iVar1 + -1;
  if (iVar1 < 2) {
    (this->m_mutex).m_threadID = 0;
    pthread_mutex_unlock((pthread_mutex_t *)&this->m_mutex);
  }
  return bVar4;
}

Assistant:

bool Initiator::isLoggedOn()
{
  Locker l(m_mutex);

  SessionIDs connected = m_connected;
  SessionIDs::iterator i = connected.begin();
  for ( ; i != connected.end(); ++i )
  {
    if( Session::lookupSession(*i)->isLoggedOn() )
      return true;
  }
  return false;
}